

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkRenderingInputAttachmentIndexInfoKHR *info)

{
  uint local_24;
  uint32_t i;
  VkRenderingInputAttachmentIndexInfoKHR *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->colorAttachmentCount);
  if (info->pColorAttachmentInputIndices == (uint32_t *)0x0) {
    Hasher::u32(h,0);
  }
  else {
    for (local_24 = 0; local_24 < info->colorAttachmentCount; local_24 = local_24 + 1) {
      Hasher::u32(h,info->pColorAttachmentInputIndices[local_24]);
    }
  }
  if (info->pDepthInputAttachmentIndex == (uint32_t *)0x0) {
    Hasher::u32(h,0xffff);
  }
  else {
    Hasher::u32(h,*info->pDepthInputAttachmentIndex);
  }
  if (info->pStencilInputAttachmentIndex == (uint32_t *)0x0) {
    Hasher::u32(h,0xffff);
  }
  else {
    Hasher::u32(h,*info->pStencilInputAttachmentIndex);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *, Hasher &h,
                              const VkRenderingInputAttachmentIndexInfoKHR &info)
{
	h.u32(info.colorAttachmentCount);

	if (info.pColorAttachmentInputIndices)
	{
		for (uint32_t i = 0; i < info.colorAttachmentCount; i++)
			h.u32(info.pColorAttachmentInputIndices[i]);
	}
	else
		h.u32(0);

	if (info.pDepthInputAttachmentIndex)
		h.u32(*info.pDepthInputAttachmentIndex);
	else
		h.u32(0xffff); // Use an arbitrary invalid attachment value.

	if (info.pStencilInputAttachmentIndex)
		h.u32(*info.pStencilInputAttachmentIndex);
	else
		h.u32(0xffff); // Use an arbitrary invalid attachment value.
}